

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendDependencyInfoLinkerFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *config,
          string *linkLanguage)

{
  cmMakefile *this_00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  string_view source;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  depFlags;
  string depFlag;
  string depFile;
  RuleVariables linkDepsVariables;
  cmRulePlaceholderExpander *local_210;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_208;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1e8;
  string *local_1d0;
  string local_1c8;
  string local_1a8;
  RuleVariables local_188;
  
  iVar2 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x35])();
  if ((char)iVar2 != '\0') {
    bVar1 = cmGeneratorTarget::HasLinkDependencyFile(target,config);
    if (bVar1) {
      this_00 = this->Makefile;
      local_1d0 = flags;
      cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[22]>
                ((string *)&local_188,(char (*) [7])0x695e73,linkLanguage,
                 (char (*) [22])"_LINKER_DEPFILE_FLAGS");
      psVar3 = (string *)cmMakefile::GetDefinition(this_00,(string *)&local_188);
      if (psVar3 == (string *)0x0) {
        psVar3 = &cmValue::Empty_abi_cxx11_;
      }
      std::__cxx11::string::string((string *)&local_1c8,(string *)psVar3);
      std::__cxx11::string::~string((string *)&local_188);
      if (local_1c8._M_string_length != 0) {
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[0xb])
                  (&local_208,this,target,config);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[2])(&local_188,this,&local_208);
        source._M_str = local_188.CMTargetName;
        source._M_len = (size_t)local_188.CMTargetType;
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_1a8,&this->super_cmOutputConverter,source,SHELL,false);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&local_208);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[6])(&local_210);
        memset(&local_188,0,0x158);
        local_188.DependencyFile = local_1a8._M_dataplus._M_p;
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (local_210,&this->super_cmOutputConverter,&local_1c8,&local_188);
        local_1e8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_1e8.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1e8);
        psVar3 = local_1d0;
        cmExpandListWithBacktrace(&local_208,&local_1c8,(cmListFileBacktrace *)&local_1e8,No);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1e8.TopEntry.
                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        cmGeneratorTarget::ResolveLinkerWrapper(target,&local_208,linkLanguage,false);
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[8])(this,psVar3,&local_208);
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector(&local_208);
        if (local_210 != (cmRulePlaceholderExpander *)0x0) {
          (*(local_210->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])();
        }
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      std::__cxx11::string::~string((string *)&local_1c8);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendDependencyInfoLinkerFlags(
  std::string& flags, cmGeneratorTarget* target, const std::string& config,
  const std::string& linkLanguage)
{
  if (!this->GetGlobalGenerator()->SupportsLinkerDependencyFile() ||
      !target->HasLinkDependencyFile(config)) {
    return;
  }

  auto depFlag = *this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", linkLanguage, "_LINKER_DEPFILE_FLAGS"));
  if (depFlag.empty()) {
    return;
  }

  auto depFile = this->ConvertToOutputFormat(
    this->MaybeRelativeToWorkDir(this->GetLinkDependencyFile(target, config)),
    cmOutputConverter::SHELL);
  auto rulePlaceholderExpander = this->CreateRulePlaceholderExpander();
  cmRulePlaceholderExpander::RuleVariables linkDepsVariables;
  linkDepsVariables.DependencyFile = depFile.c_str();
  rulePlaceholderExpander->ExpandRuleVariables(this, depFlag,
                                               linkDepsVariables);
  auto depFlags = cmExpandListWithBacktrace(depFlag);
  target->ResolveLinkerWrapper(depFlags, linkLanguage);

  this->AppendFlags(flags, depFlags);
}